

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

void __thiscall
proto2_unittest::TestRequiredOneof_NestedMessage::~TestRequiredOneof_NestedMessage
          (TestRequiredOneof_NestedMessage *this)

{
  InternalMetadata *this_00;
  ulong uVar1;
  LogMessageFatal LStack_18;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(this_00);
  }
  uVar1 = this_00->ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest.pb.cc"
             ,0x8fac,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

inline void TestRequiredOneof_NestedMessage::SharedDtor(MessageLite& self) {
  TestRequiredOneof_NestedMessage& this_ = static_cast<TestRequiredOneof_NestedMessage&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.~Impl_();
}